

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.c
# Opt level: O0

FILE * f_open(Filename *filename,char *mode,_Bool is_private)

{
  int __fd;
  int fd;
  _Bool is_private_local;
  char *mode_local;
  Filename *filename_local;
  
  if (is_private) {
    if (*mode != 'w') {
      __assert_fail("mode[0] == \'w\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/utils/filename.c"
                    ,0x41,"FILE *f_open(const Filename *, const char *, _Bool)");
    }
    __fd = open(filename->path,0x241,0x180);
    if (__fd < 0) {
      filename_local = (Filename *)0x0;
    }
    else {
      filename_local = (Filename *)fdopen(__fd,mode);
    }
  }
  else {
    filename_local = (Filename *)fopen(filename->path,mode);
  }
  return (FILE *)filename_local;
}

Assistant:

FILE *f_open(const Filename *filename, char const *mode, bool is_private)
{
    if (!is_private) {
        return fopen(filename->path, mode);
    } else {
        int fd;
        assert(mode[0] == 'w');        /* is_private is meaningless for read,
                                          and tricky for append */
        fd = open(filename->path, O_WRONLY | O_CREAT | O_TRUNC, 0600);
        if (fd < 0)
            return NULL;
        return fdopen(fd, mode);
    }
}